

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvarlengtharray.h
# Opt level: O1

void __thiscall
QVarLengthArray<(anonymous_namespace)::Part,_32LL>::push_back
          (QVarLengthArray<(anonymous_namespace)::Part,_32LL> *this,Part *t)

{
  qsizetype *pqVar1;
  undefined4 *puVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  undefined1 *__src;
  void *pvVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  size_t sVar10;
  qsizetype qVar11;
  QVLAStorage<24UL,_8UL,_32LL> *__dest;
  long lVar12;
  long in_FS_OFFSET;
  qsizetype local_48;
  QVLAStorage<24UL,_8UL,_32LL> *local_40;
  
  lVar4 = *(long *)(in_FS_OFFSET + 0x28);
  lVar5 = (this->super_QVLABase<(anonymous_namespace)::Part>).super_QVLABaseBase.a;
  lVar6 = (this->super_QVLABase<(anonymous_namespace)::Part>).super_QVLABaseBase.s;
  if (lVar6 == lVar5) {
    lVar3 = lVar6 * 2;
    lVar12 = lVar6 + 1;
    if (lVar3 - lVar12 != 0 && lVar12 <= lVar3) {
      lVar12 = lVar3;
    }
    __src = (undefined1 *)(this->super_QVLABase<(anonymous_namespace)::Part>).super_QVLABaseBase.ptr
    ;
    if (lVar5 != lVar12) {
      qVar11 = 0x20;
      __dest = &this->super_QVLAStorage<24UL,_8UL,_32LL>;
      if (0x20 < lVar12) {
        QVarLengthArray<(anonymous_namespace)::Part,32ll>::push_back();
        qVar11 = local_48;
        __dest = local_40;
      }
      if (lVar6 != 0) {
        memcpy(__dest,__src,lVar6 * 0x18);
      }
      (this->super_QVLABase<(anonymous_namespace)::Part>).super_QVLABaseBase.ptr = __dest;
      (this->super_QVLABase<(anonymous_namespace)::Part>).super_QVLABaseBase.a = qVar11;
    }
    (this->super_QVLABase<(anonymous_namespace)::Part>).super_QVLABaseBase.s = lVar6;
    if (((QVLAStorage<24UL,_8UL,_32LL> *)__src != &this->super_QVLAStorage<24UL,_8UL,_32LL>) &&
       (__src != (undefined1 *)
                 (this->super_QVLABase<(anonymous_namespace)::Part>).super_QVLABaseBase.ptr)) {
      QtPrivate::sizedFree(__src,lVar5 * 0x18);
    }
  }
  lVar5 = (this->super_QVLABase<(anonymous_namespace)::Part>).super_QVLABaseBase.s;
  pvVar7 = (this->super_QVLABase<(anonymous_namespace)::Part>).super_QVLABaseBase.ptr;
  *(undefined8 *)((long)pvVar7 + lVar5 * 0x18 + 0x10) = *(undefined8 *)&t->number;
  uVar8 = *(undefined4 *)((long)&(t->string).field_0 + 4);
  sVar10 = (t->string).m_size;
  uVar9 = *(undefined4 *)((long)&(t->string).m_size + 4);
  puVar2 = (undefined4 *)((long)pvVar7 + lVar5 * 0x18);
  *puVar2 = *(undefined4 *)&(t->string).field_0;
  puVar2[1] = uVar8;
  puVar2[2] = (int)sVar10;
  puVar2[3] = uVar9;
  pqVar1 = &(this->super_QVLABase<(anonymous_namespace)::Part>).super_QVLABaseBase.s;
  *pqVar1 = *pqVar1 + 1;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar4) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void push_back(T &&t) { append(std::move(t)); }